

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

char * clib_extname(lua_State *L,char *name)

{
  char *pcVar1;
  char *local_18;
  char *name_local;
  lua_State *L_local;
  
  pcVar1 = strchr(name,0x2f);
  local_18 = name;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(name,0x2e);
    if (pcVar1 == (char *)0x0) {
      local_18 = lj_strfmt_pushf(L,"%s.so",name);
      L->top = L->top + -1;
    }
    if (((*local_18 != 'l') || (local_18[1] != 'i')) || (local_18[2] != 'b')) {
      local_18 = lj_strfmt_pushf(L,"lib%s",local_18);
      L->top = L->top + -1;
    }
  }
  return local_18;
}

Assistant:

static const char *clib_extname(lua_State *L, const char *name)
{
  if (!strchr(name, '/')
#if LJ_TARGET_CYGWIN
      && !strchr(name, '\\')
#endif
     ) {
    if (!strchr(name, '.')) {
      name = lj_strfmt_pushf(L, CLIB_SOEXT, name);
      L->top--;
#if LJ_TARGET_CYGWIN
    } else {
      return name;
#endif
    }
    if (!(name[0] == CLIB_SOPREFIX[0] && name[1] == CLIB_SOPREFIX[1] &&
	  name[2] == CLIB_SOPREFIX[2])) {
      name = lj_strfmt_pushf(L, CLIB_SOPREFIX "%s", name);
      L->top--;
    }
  }
  return name;
}